

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O2

void __thiscall counted_functor::~counted_functor(counted_functor *this)

{
  add(-1);
  return;
}

Assistant:

~counted_functor() { add(-1); }